

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O2

Aig_Man_t * Aig_ManDupNodes(Aig_Man_t *pMan,Vec_Ptr_t *vArray)

{
  int iVar1;
  Vec_Ptr_t *p;
  Aig_Man_t *p_00;
  char *pcVar2;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *p1;
  int iVar6;
  
  iVar6 = 0;
  if (vArray->nSize == 0) {
    p_00 = (Aig_Man_t *)0x0;
  }
  else {
    p = Aig_ManDfsNodes(pMan,(Aig_Obj_t **)vArray->pArray,vArray->nSize);
    p_00 = Aig_ManStart(10000);
    pcVar2 = Abc_UtilStrsav(pMan->pName);
    p_00->pName = pcVar2;
    pMan->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
    for (; iVar1 = p->nSize, iVar6 < iVar1; iVar6 = iVar6 + 1) {
      pvVar3 = Vec_PtrEntry(p,iVar6);
      if ((*(uint *)((long)pvVar3 + 0x18) & 7) == 2) {
        pAVar4 = Aig_ObjCreateCi(p_00);
        *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar4;
      }
    }
    for (iVar6 = 0; iVar6 < iVar1; iVar6 = iVar6 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p,iVar6);
      if (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7) {
        pAVar5 = Aig_ObjChild0Copy(pAVar4);
        p1 = Aig_ObjChild1Copy(pAVar4);
        pAVar5 = Aig_And(p_00,pAVar5,p1);
        (pAVar4->field_5).pData = pAVar5;
      }
      iVar1 = p->nSize;
    }
    for (iVar6 = 0; iVar6 < vArray->nSize; iVar6 = iVar6 + 1) {
      pvVar3 = Vec_PtrEntry(vArray,iVar6);
      Aig_ObjCreateCo(p_00,*(Aig_Obj_t **)((long)pvVar3 + 0x28));
    }
    Aig_ManSetRegNum(p_00,0);
    Vec_PtrFree(p);
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupNodes( Aig_Man_t * pMan, Vec_Ptr_t * vArray )
{
    Aig_Man_t * pNew;
    Vec_Ptr_t * vObjs;
    Aig_Obj_t * pObj = NULL;
    int i;
    if ( Vec_PtrSize(vArray) == 0 )
        return NULL;
    vObjs = Aig_ManDfsNodes( pMan, (Aig_Obj_t **)Vec_PtrArray(vArray), Vec_PtrSize(vArray) );
    // create the new manager
    pNew = Aig_ManStart( 10000 );
    pNew->pName = Abc_UtilStrsav( pMan->pName );
    Aig_ManConst1(pMan)->pData = Aig_ManConst1(pNew);
    Vec_PtrForEachEntry( Aig_Obj_t *, vObjs, pObj, i )
        if ( Aig_ObjIsCi(pObj) )
            pObj->pData = Aig_ObjCreateCi(pNew);
    Vec_PtrForEachEntry( Aig_Obj_t *, vObjs, pObj, i )
        if ( Aig_ObjIsNode(pObj) )
            pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    Vec_PtrForEachEntry( Aig_Obj_t *, vArray, pObj, i )
            Aig_ObjCreateCo( pNew, (Aig_Obj_t *)pObj->pData );
    Aig_ManSetRegNum( pNew, 0 );
    Vec_PtrFree( vObjs );
    return pNew;
}